

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void call_http_client_handler(connection *conn)

{
  size_t *psVar1;
  uint *puVar2;
  mg_handler_t p_Var3;
  ulong uVar4;
  ns_connection *pnVar5;
  ulong uVar6;
  char *__dest;
  int iVar7;
  
  if (conn->cl == 0) {
    (conn->mg_conn).content_len = (conn->ns_conn->recv_iobuf).len;
  }
  (conn->mg_conn).content = (conn->ns_conn->recv_iobuf).buf;
  if ((conn->server != (mg_server *)0x0) &&
     (p_Var3 = conn->server->event_handler, p_Var3 != (mg_handler_t)0x0)) {
    iVar7 = (*p_Var3)(&conn->mg_conn,MG_REPLY);
    if (iVar7 != 0) goto LAB_0010e29a;
  }
  puVar2 = &conn->ns_conn->flags;
  *puVar2 = *puVar2 | 0x10;
LAB_0010e29a:
  uVar4 = (conn->mg_conn).content_len;
  if (uVar4 != 0) {
    pnVar5 = conn->ns_conn;
    uVar6 = (pnVar5->recv_iobuf).len;
    if (uVar4 <= uVar6) {
      __dest = (pnVar5->recv_iobuf).buf;
      memmove(__dest,__dest + uVar4,uVar6 - uVar4);
      psVar1 = &(pnVar5->recv_iobuf).len;
      *psVar1 = *psVar1 - uVar4;
    }
  }
  (conn->mg_conn).status_code = 0;
  conn->num_bytes_recv = 0;
  conn->cl = 0;
  conn->request_len = 0;
  free(conn->request);
  conn->request = (char *)0x0;
  return;
}

Assistant:

static void call_http_client_handler(struct connection *conn) {
  //conn->mg_conn.status_code = code;
  // For responses without Content-Lengh, use the whole buffer
  if (conn->cl == 0) {
    conn->mg_conn.content_len = conn->ns_conn->recv_iobuf.len;
  }
  conn->mg_conn.content = conn->ns_conn->recv_iobuf.buf;
  if (call_user(conn, MG_REPLY) == MG_FALSE) {
    conn->ns_conn->flags |= NSF_CLOSE_IMMEDIATELY;
  }
  iobuf_remove(&conn->ns_conn->recv_iobuf, conn->mg_conn.content_len);
  conn->mg_conn.status_code = 0;
  conn->cl = conn->num_bytes_recv = conn->request_len = 0;
  free(conn->request);
  conn->request = NULL;
}